

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O3

Gia_Man_t *
Gia_ManAigSyn2(Gia_Man_t *pInit,int fOldAlgo,int fCoarsen,int fCutMin,int nRelaxRatio,int fDelayMin,
              int fVerbose,int fVeryVerbose)

{
  int iVar1;
  undefined8 uVar2;
  Gia_Man_t *pGVar3;
  Gia_Man_t *pGVar4;
  Vec_Int_t *__ptr;
  int iVar5;
  Jf_Par_t Pars;
  int local_140;
  Jf_Par_t local_128;
  
  if (fOldAlgo == 0) {
    Lf_ManSetDefaultPars(&local_128);
    local_128.nAreaTuner = 1;
    local_128.nCutNum = 4;
    local_128.nRelaxRatio = nRelaxRatio;
    local_128.fCoarsen = fCoarsen;
  }
  else {
    Jf_ManSetDefaultPars(&local_128);
  }
  local_128.fCutMin = fCutMin;
  if (fVerbose != 0) {
    Gia_ManPrintStats(pInit,(Gps_Par_t *)0x0);
  }
  pGVar3 = Gia_ManDup(pInit);
  Gia_ManTransferTiming(pGVar3,pInit);
  uVar2 = local_128._84_8_;
  iVar1 = local_128.nRelaxRatio;
  if (pGVar3->nObjs == pGVar3->vCis->nSize + pGVar3->vCos->nSize + 1) {
    return pGVar3;
  }
  if ((fDelayMin != 0) && (pGVar3->pManTime == (void *)0x0)) {
    local_128.fCoarsen = 0;
    local_128.fCutMin = 0;
    local_128.nRelaxRatio = 0;
    if (fOldAlgo == 0) {
      Lf_ManPerformMapping(pGVar3,&local_128);
      iVar5 = (int)local_128.Delay;
      local_140 = (int)local_128.Area;
      pGVar4 = Gia_ManPerformDsdBalance(pGVar3,6,4,0,0);
      Lf_ManPerformMapping(pGVar4,&local_128);
    }
    else {
      Jf_ManPerformMapping(pGVar3,&local_128);
      iVar5 = (int)local_128.Delay;
      local_140 = (int)local_128.Area;
      pGVar4 = Gia_ManPerformDsdBalance(pGVar3,6,4,0,0);
      Jf_ManPerformMapping(pGVar4,&local_128);
    }
    if (((int)local_128.Delay < iVar5 + -1) ||
       ((iVar5 + 1 == (int)local_128.Delay &&
        (((double)((int)local_128.Area - local_140) * 100.0) / (double)(int)local_128.Area < 3.0))))
    {
      Gia_ManStop(pGVar3);
      pGVar3 = pGVar4;
    }
    else {
      Gia_ManStop(pGVar4);
      __ptr = pGVar3->vMapping;
      if (__ptr != (Vec_Int_t *)0x0) {
        if (__ptr->pArray != (int *)0x0) {
          free(__ptr->pArray);
          pGVar3->vMapping->pArray = (int *)0x0;
          __ptr = pGVar3->vMapping;
          if (__ptr == (Vec_Int_t *)0x0) goto LAB_00715875;
        }
        free(__ptr);
        pGVar3->vMapping = (Vec_Int_t *)0x0;
      }
    }
  }
LAB_00715875:
  local_128.nRelaxRatio = iVar1;
  local_128._84_8_ = uVar2;
  pGVar4 = Gia_ManAreaBalance(pGVar3,0,1000000000,fVeryVerbose,0);
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar4,(Gps_Par_t *)0x0);
  }
  Gia_ManStop(pGVar3);
  if (fOldAlgo == 0) {
    pGVar3 = Lf_ManPerformMapping(pGVar4,&local_128);
  }
  else {
    pGVar3 = Jf_ManPerformMapping(pGVar4,&local_128);
  }
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar3,(Gps_Par_t *)0x0);
  }
  if (pGVar4 != pGVar3) {
    Gia_ManStop(pGVar4);
  }
  pGVar4 = Gia_ManAreaBalance(pGVar3,0,1000000000,fVeryVerbose,0);
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar4,(Gps_Par_t *)0x0);
  }
  Gia_ManStop(pGVar3);
  return pGVar4;
}

Assistant:

Gia_Man_t * Gia_ManAigSyn2( Gia_Man_t * pInit, int fOldAlgo, int fCoarsen, int fCutMin, int nRelaxRatio, int fDelayMin, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * p, * pNew, * pTemp;
    Jf_Par_t Pars, * pPars = &Pars;
    if ( fOldAlgo )
    {
        Jf_ManSetDefaultPars( pPars );
        pPars->fCutMin     = fCutMin;
    }
    else
    {
        Lf_ManSetDefaultPars( pPars );
        pPars->fCutMin     = fCutMin;
        pPars->fCoarsen    = fCoarsen;
        pPars->nRelaxRatio = nRelaxRatio;
        pPars->nAreaTuner  = 1;
        pPars->nCutNum     = 4;
    }
    if ( fVerbose )  Gia_ManPrintStats( pInit, NULL );
    p = Gia_ManDup( pInit );
    Gia_ManTransferTiming( p, pInit );
    if ( Gia_ManAndNum(p) == 0 )
        return p;
    // delay optimization
    if ( fDelayMin && p->pManTime == NULL )
    {
        int Area0, Area1, Delay0, Delay1;
        int fCutMin = pPars->fCutMin;
        int fCoarsen = pPars->fCoarsen;
        int nRelaxRatio = pPars->nRelaxRatio;
        pPars->fCutMin = 0;
        pPars->fCoarsen = 0;
        pPars->nRelaxRatio = 0;
        // perform mapping
        if ( fOldAlgo )
            Jf_ManPerformMapping( p, pPars );
        else
            Lf_ManPerformMapping( p, pPars );
        Area0  = (int)pPars->Area;
        Delay0 = (int)pPars->Delay;
        // perform balancing
        pNew = Gia_ManPerformDsdBalance( p, 6, 4, 0, 0 );
        // perform mapping again
        if ( fOldAlgo )
            Jf_ManPerformMapping( pNew, pPars );
        else
            Lf_ManPerformMapping( pNew, pPars );
        Area1  = (int)pPars->Area;
        Delay1 = (int)pPars->Delay;
        // choose the best result
        if ( Delay1 < Delay0 - 1 || (Delay1 == Delay0 + 1 && 100.0 * (Area1 - Area0) / Area1 < 3.0) )
        {
            Gia_ManStop( p );
            p = pNew;
        }
        else
        {
            Gia_ManStop( pNew );
            Vec_IntFreeP( &p->vMapping );
        }
        // reset params
        pPars->fCutMin = fCutMin;
        pPars->fCoarsen = fCoarsen;
        pPars->nRelaxRatio = nRelaxRatio;
    }
    // perform balancing
    pNew = Gia_ManAreaBalance( p, 0, ABC_INFINITY, fVeryVerbose, 0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    Gia_ManStop( p );
    // perform mapping
    if ( fOldAlgo )
        pNew = Jf_ManPerformMapping( pTemp = pNew, pPars );
    else
        pNew = Lf_ManPerformMapping( pTemp = pNew, pPars );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    if ( pTemp != pNew )
        Gia_ManStop( pTemp );
    // perform balancing
    pNew = Gia_ManAreaBalance( pTemp = pNew, 0, ABC_INFINITY, fVeryVerbose, 0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    Gia_ManStop( pTemp );
    return pNew;
}